

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

NULLCArray NULLC::AllocArray(uint size,uint count,uint type)

{
  int iVar1;
  void *pvVar2;
  byte bVar3;
  char *pcVar4;
  NULLCArray NVar5;
  
  if ((ulong)count * (ulong)size < (ulong)globalMemoryLimit ||
      (ulong)count * (ulong)size - (ulong)globalMemoryLimit == 0) {
    if (*(uint *)(linker + 0x20c) <= type) {
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x7f,
                    "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
                   );
    }
    bVar3 = (byte)*(undefined4 *)(*(long *)(linker + 0x200) + 0x14 + (ulong)type * 0x50);
    if (bVar3 < 5) {
      bVar3 = 4;
    }
    iVar1 = size * count;
    if (iVar1 == 0) {
      iVar1 = 4;
    }
    pvVar2 = AllocObject(iVar1 + (uint)bVar3,type);
    if (pvVar2 != (void *)0x0) {
      pcVar4 = (char *)((long)pvVar2 + (ulong)bVar3);
      *(uint *)((long)pvVar2 + ((ulong)bVar3 - 4)) = count;
      *(byte *)((long)pvVar2 + -8) = *(byte *)((long)pvVar2 + -8) | 0x10;
      goto LAB_0011b94a;
    }
  }
  else {
    nullcThrowError("ERROR: can\'t allocate array with %u elements of size %u",count,size);
  }
  pcVar4 = (char *)0x0;
  count = 0;
LAB_0011b94a:
  NVar5.len = count;
  NVar5.ptr = pcVar4;
  return NVar5;
}

Assistant:

NULLCArray NULLC::AllocArray(unsigned size, unsigned count, unsigned type)
{
	NULLCArray ret;

	ret.len = 0;
	ret.ptr = NULL;

	if((unsigned long long)size * count > globalMemoryLimit)
	{
		nullcThrowError("ERROR: can't allocate array with %u elements of size %u", count, size);
		return ret;
	}

	ExternTypeInfo &typeInfo = NULLC::linker->exTypes[type];

	unsigned arrayPadding = typeInfo.defaultAlign > 4 ? typeInfo.defaultAlign : 4;

	unsigned bytes = count * size;
	
	if(bytes == 0)
		bytes += 4;

	char *ptr = (char*)AllocObject(bytes + arrayPadding, type);

	if(!ptr)
		return ret;

	ret.len = count;
	ret.ptr = arrayPadding + ptr;

	((unsigned*)ret.ptr)[-1] = count;

	markerType *marker = (markerType*)(ptr - sizeof(markerType));
	*marker |= OBJECT_ARRAY;

	return ret;
}